

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_alignment.c
# Opt level: O0

int ps_alignment_populate(ps_alignment_t *al)

{
  int wid_00;
  int iVar1;
  dict2pid_t *d2p_00;
  dict_t *pdVar2;
  bin_mdef_t *pbVar3;
  s3ssid_t sVar4;
  ps_alignment_entry_t *ppVar5;
  ps_alignment_entry_t *ppVar6;
  int local_74;
  int j_1;
  ps_alignment_entry_t *sent_1;
  ps_alignment_entry_t *pent;
  xwdssid_t *rssid;
  int rc;
  int j;
  int len;
  int wid;
  ps_alignment_entry_t *sent;
  ps_alignment_entry_t *went;
  int lc;
  int i;
  bin_mdef_t *mdef;
  dict_t *dict;
  dict2pid_t *d2p;
  ps_alignment_t *al_local;
  
  ps_alignment_vector_empty(&al->sseq);
  ps_alignment_vector_empty(&al->state);
  d2p_00 = al->d2p;
  pdVar2 = d2p_00->dict;
  pbVar3 = d2p_00->mdef;
  went._0_4_ = pbVar3->sil;
  went._4_4_ = 0;
  while( true ) {
    if ((int)(uint)(al->word).n_ent <= went._4_4_) {
      went._4_4_ = 0;
      do {
        if ((int)(uint)(al->sseq).n_ent <= went._4_4_) {
          return 0;
        }
        ppVar5 = (al->sseq).seq + went._4_4_;
        for (local_74 = 0; local_74 < pbVar3->n_emit_state; local_74 = local_74 + 1) {
          ppVar6 = ps_alignment_vector_grow_one(&al->state);
          if (ppVar6 == (ps_alignment_entry_t *)0x0) {
            err_msg(ERR_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_alignment.c"
                    ,0xe6,"Failed to add state entry!\n");
            return -1;
          }
          (ppVar6->id).pid.cipid = pbVar3->sseq[(ppVar5->id).pid.ssid][local_74];
          if ((ppVar6->id).pid.cipid == -1) {
            __assert_fail("sent->id.senid != BAD_SENID",
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_alignment.c"
                          ,0xea,"int ps_alignment_populate(ps_alignment_t *)");
          }
          ppVar6->start = ppVar5->start;
          ppVar6->duration = ppVar5->duration;
          ppVar6->score = 0;
          ppVar6->parent = went._4_4_;
          if (local_74 == 0) {
            ppVar5->child = (uint)(((long)ppVar6 - (long)(al->state).seq) / 0x1c) & 0xffff;
          }
        }
        went._4_4_ = went._4_4_ + 1;
      } while( true );
    }
    ppVar5 = (al->word).seq + went._4_4_;
    wid_00 = (ppVar5->id).wid;
    iVar1 = pdVar2->word[wid_00].pronlen;
    if (went._4_4_ < (int)((al->word).n_ent - 1)) {
      rssid._0_4_ = (int32)*pdVar2->word[(al->word).seq[went._4_4_ + 1].id.wid].ciphone;
    }
    else {
      rssid._0_4_ = pbVar3->sil;
    }
    ppVar6 = ps_alignment_vector_grow_one(&al->sseq);
    if (ppVar6 == (ps_alignment_entry_t *)0x0) {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_alignment.c"
              ,0xa1,"Failed to add phone entry!\n");
      return -1;
    }
    (ppVar6->id).pid.cipid = *pdVar2->word[wid_00].ciphone;
    (ppVar6->id).pid.tmatid = pbVar3->phone[(ppVar6->id).pid.cipid].tmat;
    ppVar6->start = ppVar5->start;
    ppVar6->duration = ppVar5->duration;
    ppVar6->score = 0;
    ppVar6->parent = went._4_4_;
    ppVar5->child = (uint)(((long)ppVar6 - (long)(al->sseq).seq) / 0x1c) & 0xffff;
    if (iVar1 == 1) {
      (ppVar6->id).pid.ssid = d2p_00->lrdiph_rc[(ppVar6->id).pid.cipid][(int32)went][(int32)rssid];
    }
    else {
      (ppVar6->id).pid.ssid =
           d2p_00->ldiph_lc[(ppVar6->id).pid.cipid][pdVar2->word[wid_00].ciphone[1]][(int32)went];
    }
    if ((ppVar6->id).pid.ssid == 0xffff) break;
    for (rssid._4_4_ = 1; rssid._4_4_ < iVar1 + -1; rssid._4_4_ = rssid._4_4_ + 1) {
      ppVar6 = ps_alignment_vector_grow_one(&al->sseq);
      if (ppVar6 == (ps_alignment_entry_t *)0x0) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_alignment.c"
                ,0xb7,"Failed to add phone entry!\n");
        return -1;
      }
      (ppVar6->id).pid.cipid = pdVar2->word[wid_00].ciphone[rssid._4_4_];
      (ppVar6->id).pid.tmatid = pbVar3->phone[(ppVar6->id).pid.cipid].tmat;
      sVar4 = dict2pid_internal(d2p_00,wid_00,rssid._4_4_);
      (ppVar6->id).pid.ssid = sVar4;
      if ((ppVar6->id).pid.ssid == 0xffff) {
        __assert_fail("sent->id.pid.ssid != BAD_SSID",
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_alignment.c"
                      ,0xbd,"int ps_alignment_populate(ps_alignment_t *)");
      }
      ppVar6->start = ppVar5->start;
      ppVar6->duration = ppVar5->duration;
      ppVar6->score = 0;
      ppVar6->parent = went._4_4_;
    }
    if (rssid._4_4_ < iVar1) {
      if (rssid._4_4_ != iVar1 + -1) {
        __assert_fail("j == len - 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_alignment.c"
                      ,199,"int ps_alignment_populate(ps_alignment_t *)");
      }
      ppVar6 = ps_alignment_vector_grow_one(&al->sseq);
      if (ppVar6 == (ps_alignment_entry_t *)0x0) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_alignment.c"
                ,0xc9,"Failed to add phone entry!\n");
        return -1;
      }
      (ppVar6->id).pid.cipid = pdVar2->word[wid_00].ciphone[pdVar2->word[wid_00].pronlen + -1];
      (ppVar6->id).pid.tmatid = pbVar3->phone[(ppVar6->id).pid.cipid].tmat;
      (ppVar6->id).pid.ssid =
           d2p_00->rssid[(ppVar6->id).pid.cipid]
           [pdVar2->word[wid_00].ciphone[pdVar2->word[wid_00].pronlen + -2]].ssid
           [d2p_00->rssid[(ppVar6->id).pid.cipid]
            [pdVar2->word[wid_00].ciphone[pdVar2->word[wid_00].pronlen + -2]].cimap[(int32)rssid]];
      if ((ppVar6->id).pid.ssid == 0xffff) {
        __assert_fail("sent->id.pid.ssid != BAD_SSID",
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_alignment.c"
                      ,0xd1,"int ps_alignment_populate(ps_alignment_t *)");
      }
      ppVar6->start = ppVar5->start;
      ppVar6->duration = ppVar5->duration;
      ppVar6->score = 0;
      ppVar6->parent = went._4_4_;
    }
    went._0_4_ = (int32)pdVar2->word[wid_00].ciphone[pdVar2->word[wid_00].pronlen + -1];
    went._4_4_ = went._4_4_ + 1;
  }
  __assert_fail("sent->id.pid.ssid != BAD_SSID",
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_alignment.c"
                ,0xb2,"int ps_alignment_populate(ps_alignment_t *)");
}

Assistant:

int
ps_alignment_populate(ps_alignment_t *al)
{
    dict2pid_t *d2p;
    dict_t *dict;
    bin_mdef_t *mdef;
    int i, lc;

    /* Clear phone and state sequences. */
    ps_alignment_vector_empty(&al->sseq);
    ps_alignment_vector_empty(&al->state);

    /* For each word, expand to phones/senone sequences. */
    d2p = al->d2p;
    dict = d2p->dict;
    mdef = d2p->mdef;
    lc = bin_mdef_silphone(mdef);
    for (i = 0; i < al->word.n_ent; ++i) {
        ps_alignment_entry_t *went = al->word.seq + i;
        ps_alignment_entry_t *sent;
        int wid = went->id.wid;
        int len = dict_pronlen(dict, wid);
        int j, rc;

        if (i < al->word.n_ent - 1)
            rc = dict_first_phone(dict, al->word.seq[i+1].id.wid);
        else
            rc = bin_mdef_silphone(mdef);

        /* First phone. */
        if ((sent = ps_alignment_vector_grow_one(&al->sseq)) == NULL) {
            E_ERROR("Failed to add phone entry!\n");
            return -1;
        }
        sent->id.pid.cipid = dict_first_phone(dict, wid);
        sent->id.pid.tmatid = bin_mdef_pid2tmatid(mdef, sent->id.pid.cipid);
        sent->start = went->start;
        sent->duration = went->duration;
        sent->score = 0;
        sent->parent = i;
        went->child = (uint16)(sent - al->sseq.seq);
        if (len == 1)
            sent->id.pid.ssid
                = dict2pid_lrdiph_rc(d2p, sent->id.pid.cipid, lc, rc);
        else
            sent->id.pid.ssid
                = dict2pid_ldiph_lc(d2p, sent->id.pid.cipid,
                                    dict_second_phone(dict, wid), lc);
        assert(sent->id.pid.ssid != BAD_SSID);

        /* Internal phones. */
        for (j = 1; j < len - 1; ++j) {
            if ((sent = ps_alignment_vector_grow_one(&al->sseq)) == NULL) {
                E_ERROR("Failed to add phone entry!\n");
                return -1;
            }
            sent->id.pid.cipid = dict_pron(dict, wid, j);
            sent->id.pid.tmatid = bin_mdef_pid2tmatid(mdef, sent->id.pid.cipid);
            sent->id.pid.ssid = dict2pid_internal(d2p, wid, j);
            assert(sent->id.pid.ssid != BAD_SSID);
            sent->start = went->start;
            sent->duration = went->duration;
            sent->score = 0;
            sent->parent = i;
        }

        /* Last phone. */
        if (j < len) {
            xwdssid_t *rssid;
            assert(j == len - 1);
            if ((sent = ps_alignment_vector_grow_one(&al->sseq)) == NULL) {
                E_ERROR("Failed to add phone entry!\n");
                return -1;
            }
            sent->id.pid.cipid = dict_last_phone(dict, wid);
            sent->id.pid.tmatid = bin_mdef_pid2tmatid(mdef, sent->id.pid.cipid);
            rssid = dict2pid_rssid(d2p, sent->id.pid.cipid,
                                   dict_second_last_phone(dict, wid));
            sent->id.pid.ssid = rssid->ssid[rssid->cimap[rc]];
            assert(sent->id.pid.ssid != BAD_SSID);
            sent->start = went->start;
            sent->duration = went->duration;
            sent->score = 0;
            sent->parent = i;
        }
        /* Update lc.  Could just use sent->id.pid.cipid here but that
         * seems needlessly obscure. */
        lc = dict_last_phone(dict, wid);
    }

    /* For each senone sequence, expand to senones.  (we could do this
     * nested above but this makes it more clear and easier to
     * refactor) */
    for (i = 0; i < al->sseq.n_ent; ++i) {
        ps_alignment_entry_t *pent = al->sseq.seq + i;
        ps_alignment_entry_t *sent;
        int j;

        for (j = 0; j < bin_mdef_n_emit_state(mdef); ++j) {
            if ((sent = ps_alignment_vector_grow_one(&al->state)) == NULL) {
                E_ERROR("Failed to add state entry!\n");
                return -1;
            }
            sent->id.senid = bin_mdef_sseq2sen(mdef, pent->id.pid.ssid, j);
            assert(sent->id.senid != BAD_SENID);
            sent->start = pent->start;
            sent->duration = pent->duration;
            sent->score = 0;
            sent->parent = i;
            if (j == 0)
                pent->child = (uint16)(sent - al->state.seq);
        }
    }

    return 0;
}